

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

void __thiscall Material::UpdateFrom(Material *this,Position *pos)

{
  Piece **ppPVar1;
  uint square;
  long lVar2;
  long lVar3;
  Board board;
  long local_220 [65];
  
  this->m_nCount[8] = 0;
  this->m_nCount[9] = 0;
  this->m_nCount[10] = 0;
  this->m_nCount[0xb] = 0;
  this->m_nCount[4] = 0;
  this->m_nCount[5] = 0;
  this->m_nCount[6] = 0;
  this->m_nCount[7] = 0;
  this->m_nCount[0] = 0;
  this->m_nCount[1] = 0;
  this->m_nCount[2] = 0;
  this->m_nCount[3] = 0;
  this->m_fPhase = 0.0;
  memcpy(local_220,(pos->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase.m_Piece,
         0x200);
  ppPVar1 = AllPieces;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      if (((Piece *)local_220[lVar2] != &None.super_Piece) &&
         ((Piece *)local_220[lVar2] == ppPVar1[lVar3])) {
        this->m_nCount[lVar3] = this->m_nCount[lVar3] + 1;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xc);
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x40) {
      return;
    }
  } while( true );
}

Assistant:

void Material::UpdateFrom( const Position &pos )
{
    Initialize();
    Board board = pos.GetBoard();
    for ( unsigned int square = 0; square < MAX_SQUARES; square++ )
    {
        const Piece *pPiece = board.Get( square );
        for ( int p = 0; p < AllPiecesSize; p++ )
        {
            if ( pPiece == &None )
                continue;

            if ( pPiece == AllPieces[p] )
            {
                m_nCount[p]++;
                break;
            }
        }
    }
}